

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_huf.c
# Opt level: O1

exr_result_t
internal_huf_decompress
          (exr_decode_pipeline_t *decode,uint8_t *compressed,uint64_t nCompressed,uint16_t *raw,
          uint64_t nRaw,void *spare,uint64_t sparebytes)

{
  uint uVar1;
  ulong *puVar2;
  long *plVar3;
  byte bVar4;
  uint im;
  uint iM;
  void *pvVar5;
  ulong uVar6;
  bool bVar7;
  int i;
  long lVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  ulong uVar12;
  byte bVar13;
  exr_const_context_t_conflict pctxt;
  double dVar14;
  char *pcVar15;
  uint64_t i_1;
  byte *pbVar16;
  uint uVar17;
  byte *pbVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  uint uVar23;
  ulong uVar24;
  uint uVar25;
  byte *in;
  int iVar26;
  ulong ni;
  code *pcVar27;
  bool bVar28;
  int iVar30;
  double dVar29;
  long lVar31;
  undefined1 auVar32 [16];
  uint64_t offset [59];
  size_t codeCount [59];
  uint64_t base [59];
  double local_7b0 [61];
  long local_5c8;
  int local_5c0 [118];
  undefined1 local_3e8 [480];
  ulong local_208 [59];
  
  if (decode == (exr_decode_pipeline_t *)0x0) {
    pctxt = (exr_const_context_t_conflict)0x0;
  }
  else {
    pctxt = decode->context;
  }
  if (nCompressed < 0x14) {
    uVar25 = (uint)(nRaw != 0) * 3;
  }
  else {
    uVar25 = 3;
    if (sparebytes == 0xc0008) {
      im = *(uint *)compressed;
      uVar25 = 0x17;
      if (im < 0x10001) {
        iM = *(uint *)(compressed + 4);
        uVar12 = (ulong)iM;
        if (iM < 0x10001) {
          ni = (ulong)*(uint *)(compressed + 0xc);
          uVar21 = ni + 7 >> 3;
          uVar25 = 1;
          if (uVar21 + 0x14 <= nCompressed) {
            in = compressed + 0x14;
            if (*(uint *)(compressed + 0xc) < 0x81) {
              pbVar16 = (byte *)(nCompressed - 0x14);
              uVar25 = 0;
              memset(spare,0,0xc0008);
              pbVar18 = in;
              if (im <= iM) {
                uVar12 = 0;
                uVar17 = im;
                do {
                  if (uVar25 < 6) {
                    if (pbVar16 <= pbVar18 + -(long)in) goto LAB_0010ccdb;
                    uVar25 = uVar25 | 8;
                    uVar12 = uVar12 << 8 | (ulong)*pbVar18;
                    pbVar18 = pbVar18 + 1;
                  }
                  uVar1 = uVar25 - 6;
                  uVar23 = (uint)(uVar12 >> ((byte)uVar1 & 0x3f)) & 0x3f;
                  uVar24 = (ulong)uVar23;
                  uVar21 = (ulong)uVar17;
                  *(ulong *)((long)spare + uVar21 * 8) = uVar24;
                  if (uVar24 == 0x3f) {
                    uVar23 = uVar1;
                    if (uVar1 < 8) {
                      if (pbVar16 <= pbVar18 + -(long)in) goto LAB_0010ccdb;
                      uVar25 = uVar25 + 2;
                      uVar12 = uVar12 << 8 | (ulong)*pbVar18;
                      pbVar18 = pbVar18 + 1;
                      uVar23 = uVar25;
                    }
                    uVar24 = uVar12 >> ((byte)(uVar23 - 8) & 0x3f) & 0xff;
                    if ((ulong)(iM + 1) < uVar21 + uVar24 + 6) goto LAB_0010ccdb;
                    lVar8 = uVar24 + 6;
                    uVar25 = uVar17;
                    do {
                      uVar17 = uVar25;
                      *(undefined8 *)((long)spare + (ulong)uVar17 * 8) = 0;
                      lVar8 = lVar8 + -1;
                      uVar25 = uVar17 + 1;
                      uVar1 = uVar23 - 8;
                    } while (lVar8 != 0);
                  }
                  else if (0x3a < uVar23) {
                    if ((ulong)(iM + 1) < (uVar21 + uVar24) - 0x39) goto LAB_0010ccdb;
                    for (lVar8 = uVar24 - 0x39; lVar8 != 0; lVar8 = lVar8 + -1) {
                      *(undefined8 *)((long)spare + (ulong)uVar17 * 8) = 0;
                      uVar17 = uVar17 + 1;
                    }
                    uVar17 = uVar17 - 1;
                  }
                  uVar25 = uVar1;
                  uVar17 = uVar17 + 1;
                } while (uVar17 <= iM);
              }
              pbVar16 = in + ((long)pbVar16 - (long)pbVar18);
              hufCanonicalCodeTable((uint64_t *)spare);
              in = pbVar18;
LAB_0010ccdb:
              if (ni <= (ulong)((long)pbVar16 << 3)) {
                uVar25 = hufBuildDecTable(pctxt,(uint64_t *)spare,im,iM,
                                          (HufDec *)((long)spare + 0x80008));
                if (uVar25 == 0) {
                  uVar25 = hufDecode((uint64_t *)spare,(HufDec *)((long)spare + 0x80008),in,ni,iM,
                                     nRaw,raw);
                }
                if (pctxt == (exr_const_context_t_conflict)0x0) {
                  pcVar27 = internal_exr_free;
                }
                else {
                  pcVar27 = pctxt->free_fn;
                }
                lVar8 = 0;
                do {
                  pvVar5 = *(void **)((long)spare + lVar8 + 0x80010);
                  if (pvVar5 != (void *)0x0) {
                    (*pcVar27)(pvVar5);
                    *(undefined8 *)((long)spare + lVar8 + 0x80010) = 0;
                  }
                  lVar8 = lVar8 + 0x10;
                } while (lVar8 != 0x40000);
              }
              if ((ulong)((long)pbVar16 << 3) < ni) {
                return 0x17;
              }
            }
            else {
              *(uint *)spare = iM;
              *(undefined4 *)((long)spare + 4) = 0;
              *(undefined2 *)((long)spare + 8) = 0xff;
              iVar26 = 0;
              memset(&local_5c8,0,0x1d8);
              memset(local_208,0xff,0x1d8);
              memset(local_7b0 + 1,0,0x1d8);
              if (im <= iM) {
                uVar22 = 0;
                uVar24 = (ulong)im;
                pbVar18 = in;
                do {
                  if (compressed + nCompressed <= pbVar18) {
LAB_0010ceda:
                    if (pctxt == (exr_const_context_t_conflict)0x0) goto LAB_0010d231;
                    pcVar15 = "Error decoding Huffman table (Truncated table data).";
LAB_0010d1bc:
                    uVar25 = 0x17;
                    (*pctxt->print_error)(pctxt,0x17,pcVar15);
                    bVar28 = false;
                    goto LAB_0010d23e;
                  }
                  iVar30 = iVar26;
                  if (iVar26 < 6) {
                    do {
                      bVar13 = *pbVar18;
                      pbVar18 = pbVar18 + 1;
                      uVar22 = uVar22 << 8 | (ulong)bVar13;
                      iVar30 = iVar26 + 8;
                      bVar28 = iVar26 < -2;
                      iVar26 = iVar30;
                    } while (bVar28);
                  }
                  iVar26 = iVar30 + -6;
                  uVar25 = (uint)(uVar22 >> ((byte)iVar26 & 0x3f)) & 0x3f;
                  uVar19 = (ulong)uVar25;
                  if (uVar19 < 0x3b) {
                    if (uVar19 != 0) {
                      if (uVar25 < *(byte *)((long)spare + 8)) {
                        *(char *)((long)spare + 8) = (char)uVar25;
                      }
                      if (*(byte *)((long)spare + 9) < uVar25) {
                        *(char *)((long)spare + 9) = (char)uVar25;
                      }
                      (&local_5c8)[uVar19] = (&local_5c8)[uVar19] + 1;
                      goto LAB_0010cb1b;
                    }
                  }
                  else {
                    if (uVar25 == 0x3f) {
                      if (compressed + nCompressed <= pbVar18) goto LAB_0010ceda;
                      if (iVar30 < 0xe) {
                        iVar30 = iVar30 + -0xe;
                        do {
                          iVar26 = iVar30;
                          bVar13 = *pbVar18;
                          pbVar18 = pbVar18 + 1;
                          uVar22 = (ulong)bVar13 | uVar22 << 8;
                          iVar30 = iVar26 + 8;
                        } while (iVar30 < 0);
                        iVar26 = iVar26 + 0x10;
                      }
                      iVar26 = iVar26 + -8;
                      uVar24 = uVar24 + (uVar22 >> ((byte)iVar26 & 0x3f) & 0xff) + 5;
                    }
                    else {
                      uVar24 = (uVar24 + uVar19) - 0x3a;
                    }
LAB_0010cb1b:
                    if (uVar12 < uVar24) {
                      if (pctxt != (exr_const_context_t_conflict)0x0) {
                        pcVar15 = "Error decoding Huffman table (Run beyond end of table).";
                        goto LAB_0010d1bc;
                      }
                      goto LAB_0010d231;
                    }
                  }
                  bVar28 = uVar24 < uVar12;
                  uVar24 = uVar24 + 1;
                } while (bVar28);
              }
              iVar26 = 0;
              iVar30 = 0;
              lVar8 = 0;
              do {
                iVar26 = iVar26 + (int)(&local_5c8)[lVar8];
                iVar30 = iVar30 + local_5c0[lVar8 * 2];
                lVar8 = lVar8 + 2;
              } while (lVar8 != 0x3a);
              *(int *)((long)spare + 4) = iVar30 + iVar26;
              if ((uint)(iVar30 + iVar26) < 0x10002) {
                bVar13 = *(byte *)((long)spare + 8);
                dVar9 = (double)(ulong)bVar13;
                bVar4 = *(byte *)((long)spare + 9);
                dVar14 = (double)(ulong)bVar4;
                if (bVar13 <= bVar4) {
                  lVar8 = (long)dVar14 - (long)dVar9;
                  dVar10 = dVar9;
                  do {
                    lVar20 = (&local_5c8)[(long)dVar10];
                    auVar32._8_4_ = (int)((ulong)lVar20 >> 0x20);
                    auVar32._0_8_ = lVar20;
                    auVar32._12_4_ = 0x45300000;
                    local_7b0[(long)dVar10 + 1] =
                         (double)(2L << ((byte)lVar8 & 0x3f)) *
                         ((auVar32._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)lVar20) - 4503599627370496.0));
                    dVar10 = (double)((long)dVar10 + 1);
                    bVar28 = lVar8 != 0;
                    lVar8 = lVar8 + -1;
                  } while (bVar28);
                  if (bVar13 <= bVar4) {
                    local_7b0[0] = (double)((long)dVar14 + 1);
                    dVar10 = dVar9;
                    do {
                      dVar29 = 0.0;
                      for (dVar11 = dVar10; (ulong)dVar11 < (ulong)dVar14;
                          dVar11 = (double)((long)dVar11 + 1)) {
                        dVar29 = dVar29 + local_7b0[(long)dVar11 + 2];
                      }
                      dVar11 = (double)((long)dVar10 + 1);
                      dVar29 = ceil(dVar29 / (double)(2L << (bVar4 - SUB81(dVar10,0) & 0x3f)));
                      local_208[(long)dVar10] =
                           (long)(dVar29 - 9.223372036854776e+18) & (long)dVar29 >> 0x3f |
                           (long)dVar29;
                      dVar10 = dVar11;
                    } while (dVar11 != local_7b0[0]);
                  }
                }
                local_7b0[(long)dVar14 + 1] = 0.0;
                if (bVar13 < bVar4) {
                  dVar10 = local_7b0[(long)dVar14 + 1];
                  do {
                    dVar10 = (double)((long)dVar10 + (&local_5c8)[(long)dVar14]);
                    local_7b0[(long)dVar14] = dVar10;
                    dVar14 = (double)((long)dVar14 - 1);
                  } while ((long)dVar9 < (long)dVar14);
                }
                memset(local_3e8,0xff,0x1d8);
                if (bVar13 <= bVar4) {
                  memcpy(local_208 + ((ulong)bVar13 - 0x3c),local_7b0 + (ulong)bVar13 + 1,
                         (ulong)((uint)bVar4 - (uint)bVar13) * 8 + 8);
                }
                pbVar18 = in;
                if (im <= iM) {
                  iVar26 = 0;
                  uVar22 = 0;
                  uVar24 = (ulong)im;
                  do {
                    iVar30 = iVar26;
                    if (iVar26 < 6) {
                      do {
                        bVar13 = *pbVar18;
                        pbVar18 = pbVar18 + 1;
                        uVar22 = uVar22 << 8 | (ulong)bVar13;
                        iVar26 = iVar30 + 8;
                        bVar28 = iVar30 < -2;
                        iVar30 = iVar26;
                      } while (bVar28);
                    }
                    iVar30 = iVar26 + -6;
                    uVar25 = (uint)(uVar22 >> ((byte)iVar30 & 0x3f)) & 0x3f;
                    uVar19 = (ulong)uVar25;
                    if (uVar19 < 0x3b) {
                      iVar26 = iVar30;
                      if (uVar19 != 0) {
                        uVar6 = local_208[uVar19 - 0x3c];
                        if (*(uint *)((long)spare + 4) <= uVar6) {
                          if (pctxt == (exr_const_context_t_conflict)0x0) {
LAB_0010d231:
                            uVar25 = 0x17;
                            bVar28 = false;
                          }
                          else {
                            uVar25 = 0x17;
                            (*pctxt->print_error)
                                      (pctxt,0x17,"Huffman decode error (Invalid symbol in header)")
                            ;
                            bVar28 = false;
                          }
                          goto LAB_0010d23e;
                        }
                        *(int *)((long)spare + uVar6 * 4 + 0xc) = (int)uVar24;
                        local_208[uVar19 - 0x3c] = uVar6 + 1;
                      }
                    }
                    else if (uVar25 == 0x3f) {
                      if (iVar26 < 0xe) {
                        iVar26 = iVar26 + -0xe;
                        do {
                          iVar30 = iVar26;
                          bVar13 = *pbVar18;
                          pbVar18 = pbVar18 + 1;
                          uVar22 = (ulong)bVar13 | uVar22 << 8;
                          iVar26 = iVar30 + 8;
                        } while (iVar26 < 0);
                        iVar30 = iVar30 + 0x10;
                      }
                      uVar24 = uVar24 + (uVar22 >> ((byte)(iVar30 + -8) & 0x3f) & 0xff) + 5;
                      iVar26 = iVar30 + -8;
                    }
                    else {
                      uVar24 = (uVar24 + uVar19) - 0x3a;
                      iVar26 = iVar30;
                    }
                    bVar28 = uVar24 < uVar12;
                    uVar24 = uVar24 + 1;
                  } while (bVar28);
                }
                in = pbVar18;
                bVar13 = 0;
                lVar8 = 0;
                do {
                  lVar20 = local_208[lVar8] << (bVar13 & 0x3f);
                  if (local_208[lVar8] == 0xffffffffffffffff) {
                    lVar20 = -1;
                  }
                  *(long *)((long)spare + lVar8 * 8 + 0x40010) = lVar20;
                  lVar8 = lVar8 + 1;
                  bVar13 = bVar13 - 1;
                } while (lVar8 != 0x3b);
                *(undefined8 *)((long)spare + 0x401e8) = 0;
                *(long *)((long)spare + 0x401f0) =
                     (long)local_7b0[1] - *(long *)((long)spare + 0x40010);
                lVar20 = 1;
                lVar31 = 2;
                lVar8 = 0;
                do {
                  dVar14 = local_7b0[lVar8 + 3];
                  puVar2 = (ulong *)((long)spare + lVar8 * 8 + 0x40018);
                  uVar12 = puVar2[1];
                  plVar3 = (long *)((long)spare + lVar8 * 8 + 0x401f8);
                  *plVar3 = (long)local_7b0[lVar8 + 2] - (*puVar2 >> 0x40 - lVar20);
                  plVar3[1] = (long)dVar14 - (uVar12 >> 0x40 - lVar31);
                  lVar8 = lVar8 + 2;
                  lVar20 = lVar20 + 2;
                  lVar31 = lVar31 + 2;
                } while (lVar8 != 0x3a);
                lVar8 = 0;
                do {
                  *(undefined4 *)((long)spare + lVar8 * 4 + 0x403c8) = 0xffff;
                  *(undefined1 *)((long)spare + lVar8 + 0x443c8) = 0;
                  uVar12 = (ulong)*(byte *)((long)spare + 8);
                  if (*(byte *)((long)spare + 8) <= *(byte *)((long)spare + 9)) {
                    do {
                      if (*(ulong *)((long)spare + uVar12 * 8 + 0x40010) <= (ulong)(lVar8 << 0x34))
                      {
                        *(char *)((long)spare + lVar8 + 0x443c8) = (char)uVar12;
                        uVar12 = ((ulong)(lVar8 << 0x34) >> (-(char)uVar12 & 0x3fU)) +
                                 *(long *)((long)spare + uVar12 * 8 + 0x401f0);
                        uVar25 = *(uint *)((long)spare + 4);
                        if (uVar12 < uVar25) {
                          *(undefined4 *)((long)spare + lVar8 * 4 + 0x403c8) =
                               *(undefined4 *)((long)spare + uVar12 * 4 + 0xc);
                        }
                        else if (pctxt != (exr_const_context_t_conflict)0x0) {
                          (*pctxt->print_error)(pctxt,0x17,"Huffman decode error (Overrun)");
                        }
                        if (uVar25 <= uVar12) {
                          uVar25 = 0x17;
                          bVar28 = false;
                          goto LAB_0010d23e;
                        }
                        break;
                      }
                      uVar12 = uVar12 + 1;
                    } while ((ulong)*(byte *)((long)spare + 9) + 1 != uVar12);
                  }
                  lVar8 = lVar8 + 1;
                } while (lVar8 != 0x1000);
                uVar25 = 0xc;
                do {
                  if (*(long *)((long)spare + (ulong)uVar25 * 8 + 0x40010) != -1) goto LAB_0010d194;
                  bVar28 = 1 < uVar25;
                  uVar25 = uVar25 - 1;
                } while (bVar28);
                uVar25 = 0;
LAB_0010d194:
                if ((int)uVar25 < 0) {
                  *(undefined8 *)((long)spare + 0x453c8) = 0xffffffffffffffff;
                }
                else {
                  *(undefined8 *)((long)spare + 0x453c8) =
                       *(undefined8 *)((long)spare + (ulong)uVar25 * 8 + 0x40010);
                }
                uVar25 = 0;
                bVar28 = true;
              }
              else if (pctxt == (exr_const_context_t_conflict)0x0) {
                uVar25 = 0x17;
                bVar28 = false;
              }
              else {
                uVar25 = 0x17;
                (*pctxt->print_error)(pctxt,0x17,"Error decoding Huffman table (Too many symbols).")
                ;
                bVar28 = false;
              }
LAB_0010d23e:
              bVar7 = true;
              if (bVar28) {
                bVar7 = false;
                uVar25 = 0;
                if (in + (uVar21 - (long)compressed) <= nCompressed) {
                  uVar25 = fasthuf_decode(pctxt,(FastHufDecoder *)spare,in,ni,raw,nRaw);
                  bVar7 = true;
                }
              }
              if (!bVar7) {
                return 1;
              }
            }
          }
        }
      }
    }
  }
  return uVar25;
}

Assistant:

exr_result_t
internal_huf_decompress (
    exr_decode_pipeline_t* decode,
    const uint8_t*         compressed,
    uint64_t               nCompressed,
    uint16_t*              raw,
    uint64_t               nRaw,
    void*                  spare,
    uint64_t               sparebytes)
{
    uint32_t            im, iM, nBits;
    uint64_t            nBytes;
    const uint8_t*      ptr;
    exr_result_t        rv;
    exr_const_context_t pctxt            = NULL;
    const uint64_t      hufInfoBlockSize = 5 * sizeof (uint32_t);

    if (decode) pctxt = decode->context;
    //
    // need at least 20 bytes for header
    //
    if (nCompressed < 20)
    {
        if (nRaw != 0) return EXR_ERR_INVALID_ARGUMENT;
        return EXR_ERR_SUCCESS;
    }

    if (sparebytes != internal_exr_huf_decompress_spare_bytes ())
        return EXR_ERR_INVALID_ARGUMENT;

    im = readUInt (compressed);
    iM = readUInt (compressed + 4);
    // uint32_t tableLength = readUInt (compressed + 8);
    nBits = readUInt (compressed + 12);
    // uint32_t future = readUInt (compressed + 16);

    if (im >= HUF_ENCSIZE || iM >= HUF_ENCSIZE) return EXR_ERR_CORRUPT_CHUNK;

    ptr = compressed + hufInfoBlockSize;

    nBytes = (((uint64_t) (nBits) + 7)) / 8;

    // must be nBytes remaining in buffer
    if (hufInfoBlockSize + nBytes > nCompressed) return EXR_ERR_OUT_OF_MEMORY;

    //
    // Fast decoder needs at least 2x64-bits of compressed data, and
    // needs to be run-able on this platform. Otherwise, fall back
    // to the original decoder
    //
    if (fasthuf_decode_enabled () && nBits > 128)
    {
        FastHufDecoder* fhd = (FastHufDecoder*) spare;

        rv = fasthuf_initialize (
            pctxt, fhd, &ptr, nCompressed - hufInfoBlockSize, im, iM, (int) iM);
        if (rv == EXR_ERR_SUCCESS)
        {
            if ((uint64_t) (ptr - compressed) + nBytes > nCompressed)
                return EXR_ERR_OUT_OF_MEMORY;
            rv = fasthuf_decode (pctxt, fhd, ptr, nBits, raw, nRaw);
        }
    }
    else
    {
        uint64_t* freq  = (uint64_t*) spare;
        HufDec*   hdec  = (HufDec*) (freq + HUF_ENCSIZE);
        uint64_t  nLeft = nCompressed - 20;

        hufClearDecTable (hdec);
        hufUnpackEncTable (&ptr, &nLeft, im, iM, freq);

        if (nBits > 8 * nLeft) return EXR_ERR_CORRUPT_CHUNK;

        rv = hufBuildDecTable (pctxt, freq, im, iM, hdec);
        if (rv == EXR_ERR_SUCCESS)
            rv = hufDecode (freq, hdec, ptr, nBits, iM, nRaw, raw);

        hufFreeDecTable (pctxt, hdec);
    }
    return rv;
}